

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes
          (SocketData *this,SocketType sock,int availLen,bool *complete,RTPMemoryManager *pMgr)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  undefined4 extraout_var;
  uint8_t *puVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  SocketData *pSVar8;
  ulong uVar9;
  int unaff_R12D;
  
  iVar2 = this->m_lengthBufferOffset;
  if ((long)iVar2 < 2) {
    if (this->m_pDataBuffer != (uint8_t *)0x0) {
      __assert_fail("m_pDataBuffer == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fcsl[P]jrtplib-3/src/rtptcptransmitter.cpp"
                    ,0x365,
                    "int jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType, int, bool &, RTPMemoryManager *)"
                   );
    }
    uVar6 = 2U - iVar2;
    if (availLen <= (int)(2U - iVar2)) {
      uVar6 = availLen;
    }
    if ((int)uVar6 < 1) {
      iVar2 = 0;
LAB_001294d5:
      iVar5 = this->m_lengthBufferOffset + iVar2;
      this->m_lengthBufferOffset = iVar5;
      if (2 < iVar5) {
        __assert_fail("m_lengthBufferOffset <= numLengthBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/fcsl[P]jrtplib-3/src/rtptcptransmitter.cpp"
                      ,0x375,
                      "int jrtplib::RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType, int, bool &, RTPMemoryManager *)"
                     );
      }
      availLen = availLen - iVar2;
      if (iVar5 == 2) {
        pSVar8 = (SocketData *)(this->m_lengthBuffer + 1);
        lVar7 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 | (uint)pSVar8->m_lengthBuffer[0] << ((byte)lVar7 & 0x1f);
          lVar7 = lVar7 + 8;
          pSVar8 = (SocketData *)((long)&pSVar8[0xffffffffffffffff].m_pDataBuffer + 7);
        } while (lVar7 != 0x10);
        this->m_dataLength = uVar6;
        this->m_dataBufferOffset = 0;
        uVar9 = (ulong)(int)(uVar6 + (uVar6 == 0));
        if (pMgr == (RTPMemoryManager *)0x0) {
          puVar4 = (uint8_t *)operator_new__(uVar9);
        }
        else {
          iVar2 = (*pMgr->_vptr_RTPMemoryManager[2])(pMgr,uVar9,1);
          puVar4 = (uint8_t *)CONCAT44(extraout_var,iVar2);
        }
        this->m_pDataBuffer = puVar4;
        if (puVar4 == (uint8_t *)0x0) {
          unaff_R12D = -1;
          bVar1 = false;
          goto LAB_00129551;
        }
      }
      bVar1 = true;
      unaff_R12D = -1;
    }
    else {
      bVar1 = false;
      sVar3 = recv(sock,this->m_lengthBuffer + iVar2,(ulong)uVar6,0);
      iVar2 = (int)sVar3;
      if (-1 < iVar2) goto LAB_001294d5;
      unaff_R12D = -0xc5;
    }
LAB_00129551:
    if (!bVar1) {
      return unaff_R12D;
    }
  }
  if (this->m_lengthBufferOffset != 2) {
    return 0;
  }
  if (this->m_pDataBuffer == (uint8_t *)0x0) {
    return 0;
  }
  iVar2 = this->m_dataBufferOffset;
  if (this->m_dataLength <= iVar2) goto LAB_001295b5;
  uVar6 = this->m_dataLength - iVar2;
  if (availLen <= (int)uVar6) {
    uVar6 = availLen;
  }
  if ((int)uVar6 < 1) {
    iVar2 = 0;
LAB_001295a9:
    this->m_dataBufferOffset = this->m_dataBufferOffset + iVar2;
    bVar1 = true;
  }
  else {
    bVar1 = false;
    sVar3 = recv(sock,this->m_pDataBuffer + iVar2,(ulong)uVar6,0);
    iVar2 = (int)sVar3;
    if (-1 < iVar2) goto LAB_001295a9;
    unaff_R12D = -0xc5;
  }
  if (!bVar1) {
    return unaff_R12D;
  }
LAB_001295b5:
  if (this->m_dataBufferOffset == this->m_dataLength) {
    *complete = true;
  }
  return 0;
}

Assistant:

int RTPTCPTransmitter::SocketData::ProcessAvailableBytes(SocketType sock, int availLen, bool &complete, RTPMemoryManager *pMgr)
{
	JRTPLIB_UNUSED(pMgr); // possibly unused

	const int numLengthBuffer = 2;
	if (m_lengthBufferOffset < numLengthBuffer) // first we need to get the length
	{
		assert(m_pDataBuffer == 0);
		int num = numLengthBuffer-m_lengthBufferOffset;
		if (num > availLen)
			num = availLen;

		int r = 0;
		if (num > 0)
		{
			r = (int)recv(sock, (char *)(m_lengthBuffer+m_lengthBufferOffset), num, 0);
			if (r < 0)
				return ERR_RTP_TCPTRANS_ERRORINRECV;
		}

		m_lengthBufferOffset += r;
		availLen -= r;

		assert(m_lengthBufferOffset <= numLengthBuffer);
		if (m_lengthBufferOffset == numLengthBuffer) // we can constuct a length
		{
			int l = 0;
			for (int i = numLengthBuffer-1, shift = 0 ; i >= 0 ; i--, shift += 8)
				l |= ((int)m_lengthBuffer[i]) << shift;

			m_dataLength = l;
			m_dataBufferOffset = 0;

			//cout << "Expecting " << m_dataLength << " bytes" << endl;

			// avoid allocation of length 0
			if (l == 0)
				l = 1;

			// We don't yet know if it's an RTP or RTCP packet, so we'll stick to RTP
			m_pDataBuffer = RTPNew(pMgr, RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET) uint8_t[l];
			if (m_pDataBuffer == 0)
				return ERR_RTP_OUTOFMEM;
		}
	}

	if (m_lengthBufferOffset == numLengthBuffer && m_pDataBuffer) // the last one is to make sure we didn't run out of memory
	{
		if (m_dataBufferOffset < m_dataLength)
		{
			int num = m_dataLength-m_dataBufferOffset;
			if (num > availLen)
				num = availLen;

			int r = 0;
			if (num > 0)
			{
				r = (int)recv(sock, (char *)(m_pDataBuffer+m_dataBufferOffset), num, 0);
				if (r < 0)
					return ERR_RTP_TCPTRANS_ERRORINRECV;
			}

			m_dataBufferOffset += r;
			availLen -= r;
		}

		if (m_dataBufferOffset == m_dataLength)
			complete = true;
	}
	return 0;
}